

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  byte bVar15;
  uint uVar16;
  void *pvVar17;
  parasail_matrix_t *ppVar18;
  int *piVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  char cVar23;
  byte bVar24;
  uint uVar25;
  parasail_result_t *ppVar26;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar27;
  int iVar28;
  uint uVar29;
  char *pcVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  int8_t iVar34;
  uint uVar35;
  char *__format;
  ushort uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong size;
  bool bVar43;
  undefined4 uVar44;
  undefined1 uVar48;
  undefined1 uVar50;
  undefined1 uVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  char cVar68;
  __m128i alVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i vFt;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int local_1c8;
  long local_198;
  long local_138;
  int local_130;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  __m128i_8_t e;
  __m128i_8_t h;
  char cVar49;
  char cVar51;
  char cVar53;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar30 = "profile";
  }
  else {
    pvVar17 = (profile->profile8).score;
    if (pvVar17 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar30 = "profile->profile8.score";
    }
    else {
      ppVar18 = profile->matrix;
      if (ppVar18 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar30 = "profile->matrix";
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar30 = "s2";
        }
        else {
          uVar32 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar30 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar30 = "open";
          }
          else {
            if (-1 < gap) {
              uVar25 = uVar16 - 1;
              size = (ulong)uVar16 + 0xf >> 4;
              iVar33 = -open;
              iVar27 = ppVar18->min;
              uVar59 = (uint)(byte)-(char)iVar27;
              if (iVar27 != iVar33 && SBORROW4(iVar27,iVar33) == iVar27 + open < 0) {
                uVar59 = open;
              }
              cVar23 = '~' - (char)ppVar18->max;
              ppVar26 = parasail_result_new_table1((uint)((ulong)uVar16 + 0xf) & 0x7ffffff0,s2Len);
              if (ppVar26 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar27 = (uint)(s1_end != 0) * 0x10;
              ppVar26->flag =
                   iVar27 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                   (uint)(s2_end != 0) << 0xf | ppVar26->flag | 0x10120402;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              auVar45._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar45._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar45._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
              auVar45._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              iVar27 = movmskps(iVar27,auVar45);
              if (iVar27 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_03 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar27 = s2Len + -1;
              iVar28 = 0xf - (int)(uVar25 / size);
              uVar52 = (undefined1)((uint)open >> 0x18);
              uVar50 = (undefined1)((uint)open >> 0x10);
              uVar48 = (undefined1)((uint)open >> 8);
              auVar54._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar52,uVar52),uVar50),CONCAT14(uVar50,open)) >>
                        0x20);
              auVar54[3] = uVar48;
              auVar54[2] = uVar48;
              auVar54[0] = (undefined1)open;
              auVar54[1] = auVar54[0];
              auVar54._8_8_ = 0;
              auVar45 = pshuflw(auVar54,auVar54,0);
              uVar44 = auVar45._0_4_;
              auVar58._4_4_ = uVar44;
              auVar58._0_4_ = uVar44;
              auVar58._8_4_ = uVar44;
              auVar58._12_4_ = uVar44;
              uVar52 = (undefined1)((uint)gap >> 0x18);
              uVar50 = (undefined1)((uint)gap >> 0x10);
              uVar48 = (undefined1)((uint)gap >> 8);
              auVar61._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar52,uVar52),uVar50),CONCAT14(uVar50,gap)) >>
                        0x20);
              auVar61[3] = uVar48;
              auVar61[2] = uVar48;
              auVar61[0] = (char)gap;
              auVar61[1] = auVar61[0];
              auVar61._8_8_ = 0;
              auVar45 = pshuflw(auVar61,auVar61,0);
              uVar44 = auVar45._0_4_;
              bVar24 = (char)uVar59 + 0x81;
              uVar36 = (ushort)bVar24;
              auVar45 = pshuflw(ZEXT216(CONCAT11(bVar24,bVar24)),ZEXT216(CONCAT11(bVar24,bVar24)),0)
              ;
              auVar46._0_4_ = auVar45._0_4_;
              auVar46._4_4_ = auVar46._0_4_;
              auVar46._8_4_ = auVar46._0_4_;
              auVar46._12_4_ = auVar46._0_4_;
              auVar54 = ZEXT216(CONCAT11(cVar23,cVar23));
              auVar54 = pshuflw(auVar54,auVar54,0);
              auVar72._0_4_ = auVar54._0_4_;
              auVar72._4_4_ = auVar72._0_4_;
              auVar72._8_4_ = auVar72._0_4_;
              auVar72._12_4_ = auVar72._0_4_;
              uVar52 = (undefined1)((uint)iVar28 >> 0x18);
              uVar50 = (undefined1)((uint)iVar28 >> 0x10);
              uVar48 = (undefined1)((uint)iVar28 >> 8);
              auVar60._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar52,uVar52),uVar50),CONCAT14(uVar50,iVar28))
                        >> 0x20);
              auVar60[3] = uVar48;
              auVar60[2] = uVar48;
              auVar60[0] = (undefined1)iVar28;
              auVar60[1] = auVar60[0];
              auVar60._8_8_ = 0;
              auVar60 = pshuflw(auVar60,auVar60,0);
              cVar49 = auVar60[0];
              cVar51 = auVar60[1];
              cVar53 = auVar60[2];
              cVar68 = auVar60[3];
              cVar23 = -((char)size * auVar61[0]);
              auVar61 = ZEXT216(CONCAT11(cVar23,cVar23));
              auVar61 = pshuflw(auVar61,auVar61,0);
              uVar59 = auVar61._0_4_;
              auVar70._0_8_ = CONCAT44(uVar59,uVar59);
              auVar70._8_4_ = uVar59;
              auVar70._12_4_ = uVar59;
              auVar74._0_8_ = auVar70._0_8_ << 8;
              auVar74._8_8_ = auVar70._8_8_ << 8 | (ulong)(uVar59 >> 0x18);
              auVar61 = paddsb(auVar74,ZEXT116(bVar24));
              lVar31 = (long)iVar33;
              for (uVar37 = 0; uVar37 != size; uVar37 = uVar37 + 1) {
                lVar38 = lVar31;
                for (lVar39 = 0; lVar39 != 0x10; lVar39 = lVar39 + 1) {
                  lVar40 = lVar38;
                  if (s1_beg != 0) {
                    lVar40 = 0;
                  }
                  lVar42 = -0x80;
                  if (-0x80 < lVar40) {
                    lVar42 = lVar40;
                  }
                  lVar41 = lVar40 - (ulong)(uint)open;
                  if ((long)(lVar40 - (ulong)(uint)open) < -0x7f) {
                    lVar41 = -0x80;
                  }
                  h.v[lVar39] = (int8_t)lVar42;
                  e.v[lVar39] = (int8_t)lVar41;
                  lVar38 = lVar38 - size * (uint)gap;
                }
                ptr_02[uVar37][0] = h.m[0];
                ptr_02[uVar37][1] = h.m[1];
                ptr[uVar37][0] = e.m[0];
                ptr[uVar37][1] = e.m[1];
                lVar31 = lVar31 - (ulong)(uint)gap;
              }
              *ptr_00 = '\0';
              for (uVar37 = 1; s2Len + 1 != uVar37; uVar37 = uVar37 + 1) {
                iVar34 = -0x80;
                if (-0x80 < iVar33) {
                  iVar34 = (int8_t)iVar33;
                }
                if (s2_beg != 0) {
                  iVar34 = '\0';
                }
                ptr_00[uVar37] = iVar34;
                iVar33 = iVar33 - gap;
              }
              alVar69 = (__m128i)psubsb((undefined1  [16])0x0,auVar58);
              uVar59 = (uint)size;
              for (uVar29 = uVar59 - 1; auVar60 = _DAT_008a1a20, -1 < (int)uVar29;
                  uVar29 = uVar29 - 1) {
                ptr_03[uVar29] = alVar69;
                auVar77._4_4_ = uVar44;
                auVar77._0_4_ = uVar44;
                auVar77._8_4_ = uVar44;
                auVar77._12_4_ = uVar44;
                alVar69 = (__m128i)psubsb((undefined1  [16])alVar69,auVar77);
                auVar80[0] = -((char)alVar69[0] < auVar72[0]);
                auVar80[1] = -(alVar69[0]._1_1_ < auVar72[1]);
                auVar80[2] = -(alVar69[0]._2_1_ < auVar72[2]);
                auVar80[3] = -(alVar69[0]._3_1_ < auVar72[3]);
                auVar80[4] = -(alVar69[0]._4_1_ < auVar72[4]);
                auVar80[5] = -(alVar69[0]._5_1_ < auVar72[5]);
                auVar80[6] = -(alVar69[0]._6_1_ < auVar72[6]);
                auVar80[7] = -(alVar69[0]._7_1_ < auVar72[7]);
                auVar80[8] = -((char)alVar69[1] < auVar72[8]);
                auVar80[9] = -(alVar69[1]._1_1_ < auVar72[9]);
                auVar80[10] = -(alVar69[1]._2_1_ < auVar72[10]);
                auVar80[0xb] = -(alVar69[1]._3_1_ < auVar72[0xb]);
                auVar80[0xc] = -(alVar69[1]._4_1_ < auVar72[0xc]);
                auVar80[0xd] = -(alVar69[1]._5_1_ < auVar72[0xd]);
                auVar80[0xe] = -(alVar69[1]._6_1_ < auVar72[0xe]);
                auVar80[0xf] = -(alVar69[1]._7_1_ < auVar72[0xf]);
                auVar72 = ~auVar80 & auVar72 | (undefined1  [16])alVar69 & auVar80;
              }
              lVar31 = size * uVar32;
              local_138 = 0;
              uVar37 = 0;
              auVar70 = auVar46;
              auVar67 = auVar46;
              local_1c8 = iVar27;
              while (uVar37 != uVar32) {
                uVar22 = ptr_02[uVar59 - 1][0];
                auVar73._0_8_ = uVar22 << 8;
                auVar73._8_8_ = ptr_02[uVar59 - 1][1] << 8 | uVar22 >> 0x38;
                iVar33 = ppVar18->mapper[(byte)s2[uVar37]];
                auVar80 = psubsb(auVar46,(undefined1  [16])*ptr_03);
                lVar38 = 0;
                auVar74 = auVar46;
                auVar77 = ~auVar60 & ZEXT116((byte)ptr_00[uVar37]) | auVar73;
                while( true ) {
                  if (size << 4 == lVar38) break;
                  auVar73 = *(undefined1 (*) [16])((long)*ptr_02 + lVar38);
                  auVar20._4_4_ = uVar44;
                  auVar20._0_4_ = uVar44;
                  auVar20._8_4_ = uVar44;
                  auVar20._12_4_ = uVar44;
                  auVar63 = psubsb(*(undefined1 (*) [16])((long)*ptr + lVar38),auVar20);
                  auVar82 = psubsb(auVar73,auVar58);
                  auVar83[0] = -(auVar82[0] < auVar63[0]);
                  auVar83[1] = -(auVar82[1] < auVar63[1]);
                  auVar83[2] = -(auVar82[2] < auVar63[2]);
                  auVar83[3] = -(auVar82[3] < auVar63[3]);
                  auVar83[4] = -(auVar82[4] < auVar63[4]);
                  auVar83[5] = -(auVar82[5] < auVar63[5]);
                  auVar83[6] = -(auVar82[6] < auVar63[6]);
                  auVar83[7] = -(auVar82[7] < auVar63[7]);
                  auVar83[8] = -(auVar82[8] < auVar63[8]);
                  auVar83[9] = -(auVar82[9] < auVar63[9]);
                  auVar83[10] = -(auVar82[10] < auVar63[10]);
                  auVar83[0xb] = -(auVar82[0xb] < auVar63[0xb]);
                  auVar83[0xc] = -(auVar82[0xc] < auVar63[0xc]);
                  auVar83[0xd] = -(auVar82[0xd] < auVar63[0xd]);
                  auVar83[0xe] = -(auVar82[0xe] < auVar63[0xe]);
                  auVar83[0xf] = -(auVar82[0xf] < auVar63[0xf]);
                  auVar77 = paddsb(auVar77,*(undefined1 (*) [16])
                                            ((long)pvVar17 +
                                            lVar38 + (long)(int)(iVar33 * uVar59) * 0x10));
                  auVar80 = paddsb(auVar80,*(undefined1 (*) [16])((long)*ptr_03 + lVar38));
                  auVar63 = ~auVar83 & auVar82 | auVar63 & auVar83;
                  auVar64[0] = -(auVar80[0] < auVar74[0]);
                  auVar64[1] = -(auVar80[1] < auVar74[1]);
                  auVar64[2] = -(auVar80[2] < auVar74[2]);
                  auVar64[3] = -(auVar80[3] < auVar74[3]);
                  auVar64[4] = -(auVar80[4] < auVar74[4]);
                  auVar64[5] = -(auVar80[5] < auVar74[5]);
                  auVar64[6] = -(auVar80[6] < auVar74[6]);
                  auVar64[7] = -(auVar80[7] < auVar74[7]);
                  auVar64[8] = -(auVar80[8] < auVar74[8]);
                  auVar64[9] = -(auVar80[9] < auVar74[9]);
                  auVar64[10] = -(auVar80[10] < auVar74[10]);
                  auVar64[0xb] = -(auVar80[0xb] < auVar74[0xb]);
                  auVar64[0xc] = -(auVar80[0xc] < auVar74[0xc]);
                  auVar64[0xd] = -(auVar80[0xd] < auVar74[0xd]);
                  auVar64[0xe] = -(auVar80[0xe] < auVar74[0xe]);
                  auVar64[0xf] = -(auVar80[0xf] < auVar74[0xf]);
                  auVar74 = auVar74 & auVar64 | ~auVar64 & auVar80;
                  auVar81[0] = -(auVar77[0] < auVar63[0]);
                  auVar81[1] = -(auVar77[1] < auVar63[1]);
                  auVar81[2] = -(auVar77[2] < auVar63[2]);
                  auVar81[3] = -(auVar77[3] < auVar63[3]);
                  auVar81[4] = -(auVar77[4] < auVar63[4]);
                  auVar81[5] = -(auVar77[5] < auVar63[5]);
                  auVar81[6] = -(auVar77[6] < auVar63[6]);
                  auVar81[7] = -(auVar77[7] < auVar63[7]);
                  auVar81[8] = -(auVar77[8] < auVar63[8]);
                  auVar81[9] = -(auVar77[9] < auVar63[9]);
                  auVar81[10] = -(auVar77[10] < auVar63[10]);
                  auVar81[0xb] = -(auVar77[0xb] < auVar63[0xb]);
                  auVar81[0xc] = -(auVar77[0xc] < auVar63[0xc]);
                  auVar81[0xd] = -(auVar77[0xd] < auVar63[0xd]);
                  auVar81[0xe] = -(auVar77[0xe] < auVar63[0xe]);
                  auVar81[0xf] = -(auVar77[0xf] < auVar63[0xf]);
                  *(undefined1 (*) [16])((long)*ptr + lVar38) = auVar63;
                  auVar80 = ~auVar81 & auVar77 | auVar63 & auVar81;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar38) = auVar80;
                  lVar38 = lVar38 + 0x10;
                  auVar77 = auVar73;
                }
                auVar82._0_8_ = auVar80._0_8_ << 8;
                auVar82._8_8_ = auVar80._8_8_ << 8 | auVar80._0_8_ >> 0x38;
                auVar82 = ~auVar60 & ZEXT116((byte)ptr_00[uVar37 + 1]) | auVar82;
                auVar77 = paddsb((undefined1  [16])*ptr_03,auVar82);
                auVar63[0] = -(auVar77[0] < auVar74[0]);
                auVar63[1] = -(auVar77[1] < auVar74[1]);
                auVar63[2] = -(auVar77[2] < auVar74[2]);
                auVar63[3] = -(auVar77[3] < auVar74[3]);
                auVar63[4] = -(auVar77[4] < auVar74[4]);
                auVar63[5] = -(auVar77[5] < auVar74[5]);
                auVar63[6] = -(auVar77[6] < auVar74[6]);
                auVar63[7] = -(auVar77[7] < auVar74[7]);
                auVar63[8] = -(auVar77[8] < auVar74[8]);
                auVar63[9] = -(auVar77[9] < auVar74[9]);
                auVar63[10] = -(auVar77[10] < auVar74[10]);
                auVar63[0xb] = -(auVar77[0xb] < auVar74[0xb]);
                auVar63[0xc] = -(auVar77[0xc] < auVar74[0xc]);
                auVar63[0xd] = -(auVar77[0xd] < auVar74[0xd]);
                auVar63[0xe] = -(auVar77[0xe] < auVar74[0xe]);
                auVar63[0xf] = -(auVar77[0xf] < auVar74[0xf]);
                auVar74 = ~auVar63 & auVar77 | auVar74 & auVar63;
                iVar33 = 0xe;
                while( true ) {
                  auVar75._0_8_ = auVar74._0_8_ << 8;
                  auVar75._8_8_ = auVar74._8_8_ << 8 | auVar74._0_8_ >> 0x38;
                  bVar43 = iVar33 == 0;
                  iVar33 = iVar33 + -1;
                  if (bVar43) break;
                  auVar77 = paddsb(auVar75,auVar61);
                  auVar55[0] = -(auVar77[0] < auVar74[0]);
                  auVar55[1] = -(auVar77[1] < auVar74[1]);
                  auVar55[2] = -(auVar77[2] < auVar74[2]);
                  auVar55[3] = -(auVar77[3] < auVar74[3]);
                  auVar55[4] = -(auVar77[4] < auVar74[4]);
                  auVar55[5] = -(auVar77[5] < auVar74[5]);
                  auVar55[6] = -(auVar77[6] < auVar74[6]);
                  auVar55[7] = -(auVar77[7] < auVar74[7]);
                  auVar55[8] = -(auVar77[8] < auVar74[8]);
                  auVar55[9] = -(auVar77[9] < auVar74[9]);
                  auVar55[10] = -(auVar77[10] < auVar74[10]);
                  auVar55[0xb] = -(auVar77[0xb] < auVar74[0xb]);
                  auVar55[0xc] = -(auVar77[0xc] < auVar74[0xc]);
                  auVar55[0xd] = -(auVar77[0xd] < auVar74[0xd]);
                  auVar55[0xe] = -(auVar77[0xe] < auVar74[0xe]);
                  auVar55[0xf] = -(auVar77[0xf] < auVar74[0xf]);
                  auVar74 = auVar74 & auVar55 | ~auVar55 & auVar77;
                }
                auVar74 = paddsb(auVar75,ZEXT116(bVar24));
                auVar78[0] = -(auVar74[0] < auVar82[0]);
                auVar78[1] = -(auVar74[1] < auVar82[1]);
                auVar78[2] = -(auVar74[2] < auVar82[2]);
                auVar78[3] = -(auVar74[3] < auVar82[3]);
                auVar78[4] = -(auVar74[4] < auVar82[4]);
                auVar78[5] = -(auVar74[5] < auVar82[5]);
                auVar78[6] = -(auVar74[6] < auVar82[6]);
                auVar78[7] = -(auVar74[7] < auVar82[7]);
                auVar78[8] = -(auVar74[8] < auVar82[8]);
                auVar78[9] = -(auVar74[9] < auVar82[9]);
                auVar78[10] = -(auVar74[10] < auVar82[10]);
                auVar78[0xb] = -(auVar74[0xb] < auVar82[0xb]);
                auVar78[0xc] = -(auVar74[0xc] < auVar82[0xc]);
                auVar78[0xd] = -(auVar74[0xd] < auVar82[0xd]);
                auVar78[0xe] = -(auVar74[0xe] < auVar82[0xe]);
                auVar78[0xf] = -(auVar74[0xf] < auVar82[0xf]);
                auVar77 = ~auVar78 & auVar74 | auVar82 & auVar78;
                local_198 = local_138;
                for (lVar38 = 0; size << 4 != lVar38; lVar38 = lVar38 + 0x10) {
                  auVar80 = *(undefined1 (*) [16])((long)*ptr_01 + lVar38);
                  auVar21._4_4_ = uVar44;
                  auVar21._0_4_ = uVar44;
                  auVar21._8_4_ = uVar44;
                  auVar21._12_4_ = uVar44;
                  auVar74 = psubsb(auVar74,auVar21);
                  auVar77 = psubsb(auVar77,auVar58);
                  auVar65[0] = -(auVar77[0] < auVar74[0]);
                  auVar65[1] = -(auVar77[1] < auVar74[1]);
                  auVar65[2] = -(auVar77[2] < auVar74[2]);
                  auVar65[3] = -(auVar77[3] < auVar74[3]);
                  auVar65[4] = -(auVar77[4] < auVar74[4]);
                  auVar65[5] = -(auVar77[5] < auVar74[5]);
                  auVar65[6] = -(auVar77[6] < auVar74[6]);
                  auVar65[7] = -(auVar77[7] < auVar74[7]);
                  auVar65[8] = -(auVar77[8] < auVar74[8]);
                  auVar65[9] = -(auVar77[9] < auVar74[9]);
                  auVar65[10] = -(auVar77[10] < auVar74[10]);
                  auVar65[0xb] = -(auVar77[0xb] < auVar74[0xb]);
                  auVar65[0xc] = -(auVar77[0xc] < auVar74[0xc]);
                  auVar65[0xd] = -(auVar77[0xd] < auVar74[0xd]);
                  auVar65[0xe] = -(auVar77[0xe] < auVar74[0xe]);
                  auVar65[0xf] = -(auVar77[0xf] < auVar74[0xf]);
                  auVar74 = auVar74 & auVar65 | ~auVar65 & auVar77;
                  auVar79[0] = -(auVar74[0] < auVar80[0]);
                  auVar79[1] = -(auVar74[1] < auVar80[1]);
                  auVar79[2] = -(auVar74[2] < auVar80[2]);
                  auVar79[3] = -(auVar74[3] < auVar80[3]);
                  auVar79[4] = -(auVar74[4] < auVar80[4]);
                  auVar79[5] = -(auVar74[5] < auVar80[5]);
                  auVar79[6] = -(auVar74[6] < auVar80[6]);
                  auVar79[7] = -(auVar74[7] < auVar80[7]);
                  auVar79[8] = -(auVar74[8] < auVar80[8]);
                  auVar79[9] = -(auVar74[9] < auVar80[9]);
                  auVar79[10] = -(auVar74[10] < auVar80[10]);
                  auVar79[0xb] = -(auVar74[0xb] < auVar80[0xb]);
                  auVar79[0xc] = -(auVar74[0xc] < auVar80[0xc]);
                  auVar79[0xd] = -(auVar74[0xd] < auVar80[0xd]);
                  auVar79[0xe] = -(auVar74[0xe] < auVar80[0xe]);
                  auVar79[0xf] = -(auVar74[0xf] < auVar80[0xf]);
                  auVar77 = ~auVar79 & auVar74 | auVar80 & auVar79;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar38) = auVar77;
                  piVar19 = ((ppVar26->field_4).rowcols)->score_row;
                  cVar23 = *(char *)((long)*ptr_02 + lVar38 + 1);
                  cVar1 = *(char *)((long)*ptr_02 + lVar38 + 2);
                  cVar2 = *(char *)((long)*ptr_02 + lVar38 + 3);
                  cVar3 = *(char *)((long)*ptr_02 + lVar38 + 4);
                  cVar4 = *(char *)((long)*ptr_02 + lVar38 + 5);
                  cVar5 = *(char *)((long)*ptr_02 + lVar38 + 6);
                  cVar6 = *(char *)((long)*ptr_02 + lVar38 + 7);
                  cVar7 = *(char *)((long)*ptr_02 + lVar38 + 8);
                  cVar8 = *(char *)((long)*ptr_02 + lVar38 + 9);
                  cVar9 = *(char *)((long)*ptr_02 + lVar38 + 10);
                  cVar10 = *(char *)((long)*ptr_02 + lVar38 + 0xb);
                  cVar11 = *(char *)((long)*ptr_02 + lVar38 + 0xc);
                  cVar12 = *(char *)((long)*ptr_02 + lVar38 + 0xd);
                  cVar13 = *(char *)((long)*ptr_02 + lVar38 + 0xe);
                  cVar14 = *(char *)((long)*ptr_02 + lVar38 + 0xf);
                  *(int *)((long)piVar19 + local_198) = (int)*(char *)((long)*ptr_02 + lVar38);
                  *(int *)((long)piVar19 + lVar31 * 4 + local_198) = (int)cVar23;
                  *(int *)((long)piVar19 + lVar31 * 8 + local_198) = (int)cVar1;
                  *(int *)((long)piVar19 + lVar31 * 0xc + local_198) = (int)cVar2;
                  *(int *)((long)piVar19 + lVar31 * 0x10 + local_198) = (int)cVar3;
                  *(int *)((long)piVar19 + lVar31 * 0x14 + local_198) = (int)cVar4;
                  *(int *)((long)piVar19 + lVar31 * 0x18 + local_198) = (int)cVar5;
                  *(int *)((long)piVar19 + lVar31 * 0x1c + local_198) = (int)cVar6;
                  *(int *)((long)piVar19 + lVar31 * 0x20 + local_198) = (int)cVar7;
                  *(int *)((long)piVar19 + lVar31 * 0x24 + local_198) = (int)cVar8;
                  *(int *)((long)piVar19 + lVar31 * 0x28 + local_198) = (int)cVar9;
                  *(int *)((long)piVar19 + lVar31 * 0x2c + local_198) = (int)cVar10;
                  *(int *)((long)piVar19 + lVar31 * 0x30 + local_198) = (int)cVar11;
                  *(int *)((long)piVar19 + lVar31 * 0x34 + local_198) = (int)cVar12;
                  *(int *)((long)piVar19 + lVar31 * 0x38 + local_198) = (int)cVar13;
                  *(int *)((long)piVar19 + lVar31 * 0x3c + local_198) = (int)cVar14;
                  auVar56[0] = -(auVar77[0] < auVar72[0]);
                  auVar56[1] = -(auVar77[1] < auVar72[1]);
                  auVar56[2] = -(auVar77[2] < auVar72[2]);
                  auVar56[3] = -(auVar77[3] < auVar72[3]);
                  auVar56[4] = -(auVar77[4] < auVar72[4]);
                  auVar56[5] = -(auVar77[5] < auVar72[5]);
                  auVar56[6] = -(auVar77[6] < auVar72[6]);
                  auVar56[7] = -(auVar77[7] < auVar72[7]);
                  auVar56[8] = -(auVar77[8] < auVar72[8]);
                  auVar56[9] = -(auVar77[9] < auVar72[9]);
                  auVar56[10] = -(auVar77[10] < auVar72[10]);
                  auVar56[0xb] = -(auVar77[0xb] < auVar72[0xb]);
                  auVar56[0xc] = -(auVar77[0xc] < auVar72[0xc]);
                  auVar56[0xd] = -(auVar77[0xd] < auVar72[0xd]);
                  auVar56[0xe] = -(auVar77[0xe] < auVar72[0xe]);
                  auVar56[0xf] = -(auVar77[0xf] < auVar72[0xf]);
                  auVar72 = ~auVar56 & auVar72 | auVar77 & auVar56;
                  auVar62[0] = -(auVar74[0] < auVar72[0]);
                  auVar62[1] = -(auVar74[1] < auVar72[1]);
                  auVar62[2] = -(auVar74[2] < auVar72[2]);
                  auVar62[3] = -(auVar74[3] < auVar72[3]);
                  auVar62[4] = -(auVar74[4] < auVar72[4]);
                  auVar62[5] = -(auVar74[5] < auVar72[5]);
                  auVar62[6] = -(auVar74[6] < auVar72[6]);
                  auVar62[7] = -(auVar74[7] < auVar72[7]);
                  auVar62[8] = -(auVar74[8] < auVar72[8]);
                  auVar62[9] = -(auVar74[9] < auVar72[9]);
                  auVar62[10] = -(auVar74[10] < auVar72[10]);
                  auVar62[0xb] = -(auVar74[0xb] < auVar72[0xb]);
                  auVar62[0xc] = -(auVar74[0xc] < auVar72[0xc]);
                  auVar62[0xd] = -(auVar74[0xd] < auVar72[0xd]);
                  auVar62[0xe] = -(auVar74[0xe] < auVar72[0xe]);
                  auVar62[0xf] = -(auVar74[0xf] < auVar72[0xf]);
                  auVar72 = ~auVar62 & auVar72 | auVar74 & auVar62;
                  auVar57[0] = -(auVar77[0] < auVar70[0]);
                  auVar57[1] = -(auVar77[1] < auVar70[1]);
                  auVar57[2] = -(auVar77[2] < auVar70[2]);
                  auVar57[3] = -(auVar77[3] < auVar70[3]);
                  auVar57[4] = -(auVar77[4] < auVar70[4]);
                  auVar57[5] = -(auVar77[5] < auVar70[5]);
                  auVar57[6] = -(auVar77[6] < auVar70[6]);
                  auVar57[7] = -(auVar77[7] < auVar70[7]);
                  auVar57[8] = -(auVar77[8] < auVar70[8]);
                  auVar57[9] = -(auVar77[9] < auVar70[9]);
                  auVar57[10] = -(auVar77[10] < auVar70[10]);
                  auVar57[0xb] = -(auVar77[0xb] < auVar70[0xb]);
                  auVar57[0xc] = -(auVar77[0xc] < auVar70[0xc]);
                  auVar57[0xd] = -(auVar77[0xd] < auVar70[0xd]);
                  auVar57[0xe] = -(auVar77[0xe] < auVar70[0xe]);
                  auVar57[0xf] = -(auVar77[0xf] < auVar70[0xf]);
                  auVar70 = auVar70 & auVar57 | ~auVar57 & auVar77;
                  local_198 = local_198 + uVar32 * 4;
                }
                alVar69 = ptr_02[(ulong)uVar25 % size];
                auVar66[0] = -(auVar67[0] < (char)alVar69[0]);
                auVar66[1] = -(auVar67[1] < alVar69[0]._1_1_);
                auVar66[2] = -(auVar67[2] < alVar69[0]._2_1_);
                auVar66[3] = -(auVar67[3] < alVar69[0]._3_1_);
                auVar66[4] = -(auVar67[4] < alVar69[0]._4_1_);
                auVar66[5] = -(auVar67[5] < alVar69[0]._5_1_);
                auVar66[6] = -(auVar67[6] < alVar69[0]._6_1_);
                auVar66[7] = -(auVar67[7] < alVar69[0]._7_1_);
                auVar66[8] = -(auVar67[8] < (char)alVar69[1]);
                auVar66[9] = -(auVar67[9] < alVar69[1]._1_1_);
                auVar66[10] = -(auVar67[10] < alVar69[1]._2_1_);
                auVar66[0xb] = -(auVar67[0xb] < alVar69[1]._3_1_);
                auVar66[0xc] = -(auVar67[0xc] < alVar69[1]._4_1_);
                auVar66[0xd] = -(auVar67[0xd] < alVar69[1]._5_1_);
                auVar66[0xe] = -(auVar67[0xe] < alVar69[1]._6_1_);
                auVar66[0xf] = -(auVar67[0xf] < alVar69[1]._7_1_);
                auVar76[1] = -(cVar51 == '\x0e');
                auVar76[0] = -(cVar49 == '\x0f');
                auVar76[2] = -(cVar53 == '\r');
                auVar76[3] = -(cVar68 == '\f');
                auVar76[4] = -(cVar49 == '\v');
                auVar76[5] = -(cVar51 == '\n');
                auVar76[6] = -(cVar53 == '\t');
                auVar76[7] = -(cVar68 == '\b');
                auVar76[8] = -(cVar49 == '\a');
                auVar76[9] = -(cVar51 == '\x06');
                auVar76[10] = -(cVar53 == '\x05');
                auVar76[0xb] = -(cVar68 == '\x04');
                auVar76[0xc] = -(cVar49 == '\x03');
                auVar76[0xd] = -(cVar51 == '\x02');
                auVar76[0xe] = -(cVar53 == '\x01');
                auVar76[0xf] = -(cVar68 == '\0');
                auVar76 = auVar66 & auVar76;
                local_130 = (int)uVar37;
                if ((((((((((((((((auVar76 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar76 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar76 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar76 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar76 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar76 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar76 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar76 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar76 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar76 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar76 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar76 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar76[0xf] < '\0') {
                  local_1c8 = local_130;
                }
                auVar67 = ~auVar66 & auVar67 | (undefined1  [16])alVar69 & auVar66;
                local_138 = local_138 + 4;
                uVar37 = uVar37 + 1;
              }
              if (s2_end != 0) {
                iVar33 = 0;
                while( true ) {
                  uVar32 = auVar67._0_8_;
                  lVar31 = auVar67._8_8_;
                  if (iVar28 <= iVar33) break;
                  auVar67._0_8_ = uVar32 << 8;
                  auVar67._8_8_ = lVar31 << 8 | uVar32 >> 0x38;
                  iVar33 = iVar33 + 1;
                }
                uVar36 = auVar67._14_2_ >> 8;
              }
              bVar24 = (byte)uVar36;
              local_78 = auVar54[0];
              cStack_77 = auVar54[1];
              cStack_76 = auVar54[2];
              cStack_75 = auVar54[3];
              uVar29 = uVar25;
              if (s1_end != 0) {
                uVar32 = 0;
                while( true ) {
                  bVar24 = (byte)uVar36;
                  if ((uVar59 & 0x7ffffff) << 4 == (uint)uVar32) break;
                  uVar35 = ((uint)uVar32 & 0xf) * uVar59 + ((uint)(uVar32 >> 4) & 0xfffffff);
                  if ((int)uVar35 < (int)uVar16) {
                    bVar15 = *(byte *)((long)*ptr_02 + uVar32);
                    if ((char)bVar24 < (char)bVar15) {
                      uVar36 = (ushort)bVar15;
                      uVar29 = uVar35;
                      local_1c8 = iVar27;
                    }
                    else {
                      if ((int)uVar29 <= (int)uVar35) {
                        uVar35 = uVar29;
                      }
                      if (local_1c8 != iVar27) {
                        uVar35 = uVar29;
                      }
                      if (bVar15 == bVar24) {
                        uVar29 = uVar35;
                      }
                    }
                  }
                  uVar32 = uVar32 + 1;
                }
              }
              if (s2_end == 0 && s1_end == 0) {
                alVar69 = ptr_02[(ulong)uVar25 % size];
                iVar33 = 0;
                while( true ) {
                  uVar32 = alVar69[0];
                  lVar31 = alVar69[1];
                  if (iVar28 <= iVar33) break;
                  alVar69[0] = uVar32 << 8;
                  alVar69[1] = lVar31 << 8 | uVar32 >> 0x38;
                  iVar33 = iVar33 + 1;
                }
                bVar24 = alVar69[1]._7_1_;
                uVar29 = uVar25;
                local_1c8 = iVar27;
              }
              cVar23 = auVar45[0];
              auVar47[0] = -(auVar72[0] < cVar23);
              cVar49 = auVar45[1];
              auVar47[1] = -(auVar72[1] < cVar49);
              cVar51 = auVar45[2];
              auVar47[2] = -(auVar72[2] < cVar51);
              cVar53 = auVar45[3];
              auVar47[3] = -(auVar72[3] < cVar53);
              auVar47[4] = -(auVar72[4] < cVar23);
              auVar47[5] = -(auVar72[5] < cVar49);
              auVar47[6] = -(auVar72[6] < cVar51);
              auVar47[7] = -(auVar72[7] < cVar53);
              auVar47[8] = -(auVar72[8] < cVar23);
              auVar47[9] = -(auVar72[9] < cVar49);
              auVar47[10] = -(auVar72[10] < cVar51);
              auVar47[0xb] = -(auVar72[0xb] < cVar53);
              auVar47[0xc] = -(auVar72[0xc] < cVar23);
              auVar47[0xd] = -(auVar72[0xd] < cVar49);
              auVar47[0xe] = -(auVar72[0xe] < cVar51);
              auVar47[0xf] = -(auVar72[0xf] < cVar53);
              auVar71[0] = -(local_78 < auVar70[0]);
              auVar71[1] = -(cStack_77 < auVar70[1]);
              auVar71[2] = -(cStack_76 < auVar70[2]);
              auVar71[3] = -(cStack_75 < auVar70[3]);
              auVar71[4] = -(local_78 < auVar70[4]);
              auVar71[5] = -(cStack_77 < auVar70[5]);
              auVar71[6] = -(cStack_76 < auVar70[6]);
              auVar71[7] = -(cStack_75 < auVar70[7]);
              auVar71[8] = -(local_78 < auVar70[8]);
              auVar71[9] = -(cStack_77 < auVar70[9]);
              auVar71[10] = -(cStack_76 < auVar70[10]);
              auVar71[0xb] = -(cStack_75 < auVar70[0xb]);
              auVar71[0xc] = -(local_78 < auVar70[0xc]);
              auVar71[0xd] = -(cStack_77 < auVar70[0xd]);
              auVar71[0xe] = -(cStack_76 < auVar70[0xe]);
              auVar71[0xf] = -(cStack_75 < auVar70[0xf]);
              auVar71 = auVar71 | auVar47;
              if ((((((((((((((((auVar71 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar71 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar71 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar71 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar71 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar71 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar71 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar71 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar71 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar71 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar71 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar71 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar71[0xf] < '\0') {
                *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
                bVar24 = 0;
                local_1c8 = 0;
                uVar29 = 0;
              }
              ppVar26->score = (int)(char)bVar24;
              ppVar26->end_query = uVar29;
              ppVar26->end_ref = local_1c8;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar26;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar30 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan_profile_sse2_128_8",pcVar30);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHp = _mm_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vE, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vHp = _mm_adds_epi8(vHp, vW);
            vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm_max_epi8_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHt = _mm_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            vF = _mm_max_epi8_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        vH = _mm_max_epi8_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vF, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vH = _mm_max_epi8_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}